

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O2

void verb_prog_harness_crystal(OBJ_DATA *obj,CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  OBJ_AFFECT_DATA *pOVar5;
  CClass *pCVar6;
  double dVar7;
  
  pOVar5 = affect_find_obj(obj->affected,(int)gsn_fashion_crystal);
  if (pOVar5 == (OBJ_AFFECT_DATA *)0x0) {
    send_to_char("This crystal is devoid of magical energy.\n\r",ch);
    return;
  }
  if (pOVar5->owner == ch) {
    iVar3 = 0x32;
    goto LAB_0032f64d;
  }
  pCVar6 = char_data::Class(ch);
  bVar1 = RString::operator==(&pCVar6->name,"sorcerer");
  if (bVar1) {
LAB_0032f622:
    iVar3 = 0x19;
    iVar4 = 0x28;
  }
  else {
    pCVar6 = char_data::Class(ch);
    bVar1 = RString::operator==(&pCVar6->name,"shapeshifter");
    if (bVar1) goto LAB_0032f622;
    pCVar6 = char_data::Class(ch);
    bVar1 = RString::operator==(&pCVar6->name,"necromancer");
    if (bVar1) goto LAB_0032f622;
    pCVar6 = char_data::Class(ch);
    bVar1 = RString::operator==(&pCVar6->name,"chronomancer");
    if (bVar1) goto LAB_0032f622;
    iVar3 = 5;
    iVar4 = 0x14;
  }
  iVar3 = number_range(iVar3,iVar4);
LAB_0032f64d:
  act("Focusing intently on the charged crystal, you harness the energy stored within.",ch,
      (void *)0x0,(void *)0x0,3);
  act("$n focuses intently on a glowing crystal in $s hands.",ch,(void *)0x0,(void *)0x0,0);
  sVar2 = pOVar5->modifier;
  extract_obj(obj);
  if (iVar3 < 0x15) {
    iVar4 = number_percent();
    if (0x32 < iVar4) {
      act("The crystal crumbles into dust and the energy dissipates as your focus falters.",ch,
          (void *)0x0,(void *)0x0,3);
      return;
    }
  }
  act("The crystal crumbles to dust as you harness the mana stored within.",ch,(void *)0x0,
      (void *)0x0,3);
  sVar2 = (short)((iVar3 * sVar2) / 100) + ch->mana;
  ch->mana = sVar2;
  dVar7 = (double)(int)ch->max_mana * 1.25;
  if (dVar7 < (double)(int)sVar2) {
    ch->mana = (short)(int)dVar7;
  }
  return;
}

Assistant:

void verb_prog_harness_crystal(OBJ_DATA *obj, CHAR_DATA *ch, char *argument)
{
	OBJ_AFFECT_DATA *oaf;
	int mana, efficiency;

	oaf = affect_find_obj(obj->affected, gsn_fashion_crystal);

	if (!oaf)
	{
		send_to_char("This crystal is devoid of magical energy.\n\r", ch);
		return;
	}

	if (oaf->owner == ch)
	{
		efficiency = 50;
	}
	else if (ch->Class()->name == "sorcerer"
		|| ch->Class()->name == "shapeshifter"
		|| ch->Class()->name == "necromancer"
		|| ch->Class()->name == "chronomancer")
	{
		efficiency = number_range(25, 40);
	}
	else
	{
		efficiency = number_range(5, 20);
	}

	act("Focusing intently on the charged crystal, you harness the energy stored within.", ch, 0, 0, TO_CHAR);
	act("$n focuses intently on a glowing crystal in $s hands.", ch, 0, 0, TO_ROOM);

	mana = oaf->modifier;

	extract_obj(obj);

	if (efficiency <= 20 && number_percent() > 50)
	{
		act("The crystal crumbles into dust and the energy dissipates as your focus falters.", ch, 0, 0, TO_CHAR);
		return;
	}

	act("The crystal crumbles to dust as you harness the mana stored within.", ch, 0, 0, TO_CHAR);

	mana *= efficiency;
	mana /= 100;
	ch->mana += mana;

	if (ch->mana > (1.25 * ch->max_mana))
		ch->mana = (short)(ch->max_mana * 1.25);
}